

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cc
# Opt level: O3

void Minisat::printOptionsDependencies(FILE *pcsFile,int granularity)

{
  char *pcVar1;
  vec<Minisat::Option_*> *pvVar2;
  char *pcVar3;
  long lVar4;
  char *pcVar5;
  
  pvVar2 = Option::getOptionList();
  sort<Minisat::Option*,Minisat::Option::OptionLt>(pvVar2->data,pvVar2->sz);
  pvVar2 = Option::getOptionList();
  if (0 < pvVar2->sz) {
    lVar4 = 0;
    pcVar3 = (char *)0x0;
    pcVar5 = (char *)0x0;
    do {
      pvVar2 = Option::getOptionList();
      if (pvVar2->data[lVar4]->dependOnNonDefaultOf != (Option *)0x0) {
        pvVar2 = Option::getOptionList();
        pcVar1 = pvVar2->data[lVar4]->category;
        pvVar2 = Option::getOptionList();
        if (pcVar1 == pcVar3) {
          if (pvVar2->data[lVar4]->type_name != pcVar5) {
            fputc(10,(FILE *)pcsFile);
          }
        }
        else {
          fprintf((FILE *)pcsFile,"\n#\n#%s OPTIONS:\n#\n",pcVar1);
        }
        pvVar2 = Option::getOptionList();
        Option::printOptionsDependencies(pvVar2->data[lVar4],pcsFile,granularity);
        pvVar2 = Option::getOptionList();
        pcVar3 = pvVar2->data[lVar4]->category;
        pvVar2 = Option::getOptionList();
        pcVar5 = pvVar2->data[lVar4]->type_name;
      }
      lVar4 = lVar4 + 1;
      pvVar2 = Option::getOptionList();
    } while (lVar4 < pvVar2->sz);
  }
  return;
}

Assistant:

void MERGESAT_NSPACE::printOptionsDependencies(FILE *pcsFile, int granularity)
{
    sort(Option::getOptionList(), Option::OptionLt());

    const char *prev_cat = nullptr;
    const char *prev_type = nullptr;

    // all options in the global list
    for (int i = 0; i < Option::getOptionList().size(); i++) {

        // no dependency
        if (Option::getOptionList()[i]->dependOnNonDefaultOf == 0) { // or too deep in the dependency level
            continue;
        } // can jump over full categories

        const char *cat = Option::getOptionList()[i]->category;
        const char *type = Option::getOptionList()[i]->type_name;

        // print new category
        if (cat != prev_cat) {
            fprintf(pcsFile, "\n#\n#%s OPTIONS:\n#\n", cat);
        } else if (type != prev_type) {
            fprintf(pcsFile, "\n");
        }

        // print the actual option
        Option::getOptionList()[i]->printOptionsDependencies(pcsFile, granularity);

        // set prev values, so that print is nicer
        prev_cat = Option::getOptionList()[i]->category;
        prev_type = Option::getOptionList()[i]->type_name;
    }
}